

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Variables.cpp
# Opt level: O0

TVariableIndex __thiscall
Refal2::CVariablesBuilder::AddLeft(CVariablesBuilder *this,TVariableName name,TVariableTypeTag type)

{
  int iVar1;
  bool bVar2;
  TVariableType TVar3;
  CVariableData *pCVar4;
  CVariableData *variable_1;
  TVariableIndex variableIndex_1;
  CVariableData *variable;
  TVariableIndex variableIndex;
  TVariableType variableType;
  CQualifier *defaultQualifier;
  TVariableTypeTag type_local;
  CVariablesBuilder *pCStack_18;
  TVariableName name_local;
  CVariablesBuilder *this_local;
  
  _variableIndex = (CQualifier *)0x0;
  defaultQualifier._6_1_ = type;
  defaultQualifier._7_1_ = name;
  pCStack_18 = this;
  TVar3 = checkTypeTag(this,type,(CQualifier **)&variableIndex);
  if ((TVar3 != VT_None) && (bVar2 = checkName(this,defaultQualifier._7_1_), bVar2)) {
    if (*(int *)(&(this->super_CErrorsHelper).field_0xa4 + (ulong)defaultQualifier._7_1_ * 4) == -1)
    {
      *(int *)(&(this->super_CErrorsHelper).field_0xa4 + (ulong)defaultQualifier._7_1_ * 4) =
           this->firstFreeVariableIndex;
      this->firstFreeVariableIndex = this->firstFreeVariableIndex + 1;
      iVar1 = *(int *)(&(this->super_CErrorsHelper).field_0xa4 + (ulong)defaultQualifier._7_1_ * 4);
      pCVar4 = this->variables + iVar1;
      pCVar4->Type = TVar3;
      pCVar4->CountLeft = 1;
      pCVar4->CountRight = 0;
      bVar2 = CQualifier::IsEmpty(&pCVar4->Qualifier);
      if (!bVar2) {
        __assert_fail("variable.Qualifier.IsEmpty()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/Variables.cpp"
                      ,0x83,
                      "TVariableIndex Refal2::CVariablesBuilder::AddLeft(const TVariableName, const TVariableTypeTag)"
                     );
      }
      if (_variableIndex == (CQualifier *)0x0) {
        return iVar1;
      }
      CQualifier::operator=(&pCVar4->Qualifier,_variableIndex);
      return iVar1;
    }
    iVar1 = *(int *)(&(this->super_CErrorsHelper).field_0xa4 + (ulong)defaultQualifier._7_1_ * 4);
    pCVar4 = this->variables + iVar1;
    if (pCVar4->Type == TVar3) {
      pCVar4->CountRight = pCVar4->CountRight + 1;
      return iVar1;
    }
    errorTypesNotMatched(this,defaultQualifier._7_1_,pCVar4->Type);
  }
  return -1;
}

Assistant:

TVariableIndex CVariablesBuilder::AddLeft( const TVariableName name,
	const TVariableTypeTag type )
{
	const CQualifier* defaultQualifier = nullptr;
	const TVariableType variableType = checkTypeTag( type, &defaultQualifier );
	if( variableType != VT_None && checkName( name ) ) {
		if( variableNameToIndex[name] == InvalidVariableIndex ) {
			variableNameToIndex[name] = firstFreeVariableIndex;
			firstFreeVariableIndex++;
			const TVariableIndex variableIndex = variableNameToIndex[name];
			CVariableData& variable = variables[variableIndex];
			variable.Type = variableType;
			variable.CountLeft = 1;
			variable.CountRight = 0;
			assert( variable.Qualifier.IsEmpty() );
			if( defaultQualifier != nullptr ) {
				variable.Qualifier = *defaultQualifier;
			}
			return variableIndex;
		} else {
			const TVariableIndex variableIndex = variableNameToIndex[name];
			CVariableData& variable = variables[variableIndex];
			if( variable.Type == variableType ) {
				variable.CountRight++;
				return variableIndex;
			} else {
				errorTypesNotMatched( name, variable.Type );
			}
		}
	}
	return InvalidVariableIndex;
}